

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O3

string_view __thiscall
gmlc::utilities::string_viewOps::removeQuotes(string_viewOps *this,string_view str)

{
  undefined1 auVar1 [16];
  ulong uVar3;
  uint uVar5;
  string_view sVar6;
  string_view input;
  string_view trimCharacters;
  size_t sVar2;
  byte *pbVar4;
  
  input._M_str = (char *)str._M_len;
  input._M_len = (size_t)this;
  trimCharacters._M_str = " \t\n\r";
  trimCharacters._M_len = 4;
  sVar6 = trim(input,trimCharacters);
  pbVar4 = (byte *)sVar6._M_str;
  sVar2 = sVar6._M_len;
  if (sVar2 == 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pbVar4;
    sVar6 = (string_view)(auVar1 << 0x40);
  }
  else {
    uVar5 = *pbVar4 - 0x22;
    if (((uVar5 < 0x3f) && ((0x4000000000000021U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) &&
       (pbVar4[sVar2 - 1] == *pbVar4)) {
      uVar3 = sVar2 - 1;
      if (sVar2 - 2 <= sVar2 - 1) {
        uVar3 = sVar2 - 2;
      }
      sVar6._M_str = (char *)(pbVar4 + 1);
      sVar6._M_len = uVar3;
    }
  }
  return sVar6;
}

Assistant:

std::string_view removeQuotes(std::string_view str)
{
    std::string_view ret = trim(str);
    if (!ret.empty()) {
        if ((ret.front() == '\"') || (ret.front() == '\'') ||
            (ret.front() == '`')) {
            if (ret.back() == ret.front()) {
                return ret.substr(1, ret.size() - 2);
            }
        }
    }
    return ret;
}